

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O1

Nwk_Man_t * Nwk_ManAlloc(void)

{
  Nwk_Man_t *pNVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Aig_MmFlex_t *pAVar4;
  Hop_Man_t *pHVar5;
  
  pNVar1 = (Nwk_Man_t *)malloc(0x80);
  pNVar1->pName = (char *)0x0;
  pNVar1->pSpec = (char *)0x0;
  pNVar1->vCis = (Vec_Ptr_t *)0x0;
  pNVar1->vCos = (Vec_Ptr_t *)0x0;
  pNVar1->vObjs = (Vec_Ptr_t *)0x0;
  pNVar1->nObjs[0] = 0;
  pNVar1->nObjs[1] = 0;
  pNVar1->nObjs[2] = 0;
  pNVar1->nObjs[3] = 0;
  *(undefined8 *)(pNVar1->nObjs + 4) = 0;
  pNVar1->pManHop = (Hop_Man_t *)0x0;
  pNVar1->pManTime = (Tim_Man_t *)0x0;
  pNVar1->pLutLib = (If_LibLut_t *)0x0;
  pNVar1->pMemObjs = (Aig_MmFlex_t *)0x0;
  pNVar1->vTemp = (Vec_Ptr_t *)0x0;
  pNVar1->nTravIds = 0;
  pNVar1->nRealloced = 0;
  pNVar1->nLatches = 0;
  pNVar1->nTruePis = 0;
  *(undefined8 *)&pNVar1->nTruePos = 0;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pNVar1->vCis = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pNVar1->vCos = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pNVar1->vObjs = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  pNVar1->vTemp = pVVar2;
  pNVar1->nFanioPlus = 2;
  pAVar4 = Aig_MmFlexStart();
  pNVar1->pMemObjs = pAVar4;
  pHVar5 = Hop_ManStart();
  pNVar1->pManHop = pHVar5;
  return pNVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nwk_Man_t * Nwk_ManAlloc()
{
    Nwk_Man_t * p;
    p = ABC_ALLOC( Nwk_Man_t, 1 );
    memset( p, 0, sizeof(Nwk_Man_t) );
    p->vCis = Vec_PtrAlloc( 1000 );
    p->vCos = Vec_PtrAlloc( 1000 );
    p->vObjs = Vec_PtrAlloc( 1000 );
    p->vTemp = Vec_PtrAlloc( 1000 );
    p->nFanioPlus = 2;
    p->pMemObjs = Aig_MmFlexStart();
    p->pManHop = Hop_ManStart();
    return p;
}